

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# zero_copy_stream_impl_lite.cc
# Opt level: O0

bool __thiscall
google::protobuf::io::CopyingOutputStreamAdaptor::Next
          (CopyingOutputStreamAdaptor *this,void **data,int *size)

{
  bool bVar1;
  pointer puVar2;
  int *size_local;
  void **data_local;
  CopyingOutputStreamAdaptor *this_local;
  
  if ((this->buffer_used_ != this->buffer_size_) || (bVar1 = WriteBuffer(this), bVar1)) {
    AllocateBufferIfNeeded(this);
    puVar2 = std::unique_ptr<unsigned_char[],_std::default_delete<unsigned_char[]>_>::get
                       (&this->buffer_);
    *data = puVar2 + this->buffer_used_;
    *size = this->buffer_size_ - this->buffer_used_;
    this->buffer_used_ = this->buffer_size_;
    this_local._7_1_ = true;
  }
  else {
    this_local._7_1_ = false;
  }
  return this_local._7_1_;
}

Assistant:

bool CopyingOutputStreamAdaptor::Next(void** data, int* size) {
  if (buffer_used_ == buffer_size_) {
    if (!WriteBuffer()) return false;
  }

  AllocateBufferIfNeeded();

  *data = buffer_.get() + buffer_used_;
  *size = buffer_size_ - buffer_used_;
  buffer_used_ = buffer_size_;
  return true;
}